

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::checkBitwiseToBool(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  Expr *e;
  Expr *e_00;
  int32_t dummy;
  int32_t dummy_1;
  int32_t local_30 [2];
  
  if ((this->effectsOnly != false) || (2 < (bin->super_Expr).super_Node._op - TO_OR)) {
    return;
  }
  local_30[0] = -1;
  e = maybeEval(this,bin->_lhs,local_30,false);
  local_30[1] = 0xffffffff;
  e_00 = maybeEval(this,bin->_rhs,local_30 + 1,false);
  bVar1 = looksLikeBooleanExpr(e);
  if ((!bVar1) && (bVar1 = looksLikeBooleanExpr(e_00), !bVar1)) {
    return;
  }
  report(this,(Node *)bin,0x3c);
  return;
}

Assistant:

void CheckerVisitor::checkBitwiseToBool(const BinExpr *bin) {

  if (effectsOnly)
    return;

  if (!isBitwiseOperator(bin->op()))
    return;

  const Expr *lhs = maybeEval(bin->lhs());
  const Expr *rhs = maybeEval(bin->rhs());

  if (looksLikeBooleanExpr(lhs) || looksLikeBooleanExpr(rhs)) {
    report(bin, DiagnosticsId::DI_BITWISE_OP_TO_BOOL);
  }

}